

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stlio.hpp
# Opt level: O2

bool tyti::stl::read<float>(basic_solid<float> *out,string *fileName)

{
  bool bVar1;
  string str;
  ifstream f;
  
  std::ifstream::ifstream(&f,(string *)fileName,_S_bin);
  str._M_dataplus._M_p = (pointer)&str.field_2;
  str._M_string_length = 0;
  str.field_2._M_local_buf[0] = '\0';
  std::istream::seekg((long)&f,_S_beg);
  std::istream::tellg();
  std::__cxx11::string::resize((ulong)&str);
  std::istream::seekg((long)&f,_S_beg);
  std::istream::read((char *)&f,(long)str._M_dataplus._M_p);
  std::ifstream::close();
  bVar1 = read<float,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    (out,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )str._M_dataplus._M_p,
                     (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )(str._M_dataplus._M_p + str._M_string_length));
  std::__cxx11::string::~string((string *)&str);
  std::ifstream::~ifstream(&f);
  return bVar1;
}

Assistant:

inline bool read(basic_solid<T>& out, const std::string& fileName)
        {
            std::ifstream f(fileName, std::ios::binary);
            std::string str;
            f.seekg(0, std::ios::end);
            str.resize((unsigned)f.tellg());
            f.seekg(0, std::ios::beg);
            f.read(&str[0], str.size());
            f.close();

            return read<T>(out, str.cbegin(), str.cend());
        }